

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myapi.hpp
# Opt level: O0

Error __thiscall fake::MyFakeAPI::Call(MyFakeAPI *this,int x)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Error EVar2;
  ContextType local_13d0;
  undefined4 local_13c8;
  ContextType local_13c4;
  result_type local_13bc;
  int local_13b8;
  result_type r2;
  result_type r1;
  uniform_int_distribution<int> local_13a8;
  uniform_int_distribution<int> dist;
  random_device rd;
  int x_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (x < 0) {
    EVar2 = ErrArgumentNeg::E();
    _Var1 = EVar2.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  else if (x == 0) {
    EVar2 = ErrArgumentZero::E();
    _Var1 = EVar2.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  else {
    std::random_device::random_device((random_device *)&dist);
    std::uniform_int_distribution<int>::uniform_int_distribution(&local_13a8,0,3);
    local_13b8 = std::uniform_int_distribution<int>::operator()(&local_13a8,(random_device *)&dist);
    local_13bc = std::uniform_int_distribution<int>::operator()(&local_13a8,(random_device *)&dist);
    if (local_13b8 < x) {
      if (local_13bc < x) {
        std::shared_ptr<gerr::details::IError>::shared_ptr
                  ((shared_ptr<gerr::details::IError> *)this,(nullptr_t)0x0);
      }
      else {
        local_13d0.randNum1 = local_13b8;
        local_13d0.randNum2 = local_13bc;
        ErrLERandNum2::E((ErrLERandNum2 *)this,&local_13d0);
      }
    }
    else {
      local_13c4.randNum1 = local_13b8;
      local_13c4.randNum2 = local_13bc;
      ErrLERandNum1::E((ErrLERandNum1 *)this,&local_13c4);
    }
    local_13c8 = 1;
    std::random_device::~random_device((random_device *)&dist);
    _Var1._M_pi = extraout_RDX;
  }
  EVar2.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  EVar2.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Error)EVar2.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static gerr::Error Call(int x) {
    if (x < 0) {
      return ErrArgumentNeg::E();
    }
    if (x == 0) {
      return ErrArgumentZero::E();
    }
    std::random_device rd;
    std::uniform_int_distribution<int> dist(0, 3);
    auto const r1 = dist(rd);
    auto const r2 = dist(rd);
    if (x <= r1) {
      return ErrLERandNum1::E({r1, r2});
      // 如果使用 ErrLERandNumComplex 来进行定义，就需要使用 Make 函数
      // return gerr::Make<ErrLERandNumComplex>(r1, r2);
    }
    if (x <= r2) {
      return ErrLERandNum2::E({r1, r2});
    }
    return nullptr;
  }